

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O2

void test_chain_constructors<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false,false,true>>>
               (void)

{
  Index *pIVar1;
  Index local_790 [2];
  undefined **local_788;
  undefined1 local_780;
  undefined8 *local_778;
  char *local_770;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ordered_boundaries;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  mb;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  mc1;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  mm;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  mr;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  mc2;
  char *local_458;
  char *local_450;
  undefined1 *local_448;
  undefined1 *local_440;
  char *local_438;
  char *local_430;
  char *local_428;
  char *local_420;
  undefined1 *local_418;
  undefined1 *local_410;
  char *local_408;
  char *local_400;
  char *local_3f8;
  char *local_3f0;
  undefined1 *local_3e8;
  undefined1 *local_3e0;
  char *local_3d8;
  char *local_3d0;
  char *local_3c8;
  char *local_3c0;
  undefined1 *local_3b8;
  undefined1 *local_3b0;
  char *local_3a8;
  char *local_3a0;
  char *local_398;
  char *local_390;
  undefined1 *local_388;
  undefined1 *local_380;
  char *local_378;
  char *local_370;
  char *local_368;
  char *local_360;
  undefined1 *local_358;
  undefined1 *local_350;
  char *local_348;
  char *local_340;
  char *local_338;
  char *local_330;
  undefined1 *local_328;
  undefined1 *local_320;
  char *local_318;
  char *local_310;
  char *local_308;
  char *local_300;
  undefined1 *local_2f8;
  undefined1 *local_2f0;
  char *local_2e8;
  char *local_2e0;
  char *local_2d8;
  char *local_2d0;
  undefined1 *local_2c8;
  undefined1 *local_2c0;
  char *local_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  undefined1 *local_298;
  undefined1 *local_290;
  char *local_288;
  char *local_280;
  char *local_278;
  char *local_270;
  undefined1 *local_268;
  undefined1 *local_260;
  char *local_258;
  char *local_250;
  char *local_248;
  char *local_240;
  undefined1 *local_238;
  undefined1 *local_230;
  char *local_228;
  char *local_220;
  char *local_218;
  char *local_210;
  undefined1 *local_208;
  undefined1 *local_200;
  char *local_1f8;
  char *local_1f0;
  char *local_1e8;
  char *local_1e0;
  undefined1 *local_1d8;
  undefined1 *local_1d0;
  char *local_1c8;
  char *local_1c0;
  char *local_1b8;
  char *local_1b0;
  undefined1 *local_1a8;
  undefined1 *local_1a0;
  char *local_198;
  char *local_190;
  char *local_188;
  char *local_180;
  undefined1 *local_178;
  undefined1 *local_170;
  char *local_168;
  char *local_160;
  char *local_158;
  char *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  char *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  undefined1 *local_118;
  undefined1 *local_110;
  char *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  undefined1 *local_e8;
  undefined1 *local_e0;
  char *local_d8;
  char *local_d0;
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  m;
  
  build_simple_boundary_matrix<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false,false,true>>>>
            ();
  mb.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mb.matrix_._4_4_ = 0;
  mb.colSettings_ = (Column_settings *)birth_comp;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mr.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mr.matrix_._4_4_ = 0;
  mr.colSettings_ = (Column_settings *)death_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::Matrix(&m,(function<bool_(unsigned_int,_unsigned_int)> *)&mb,
           (function<bool_(unsigned_int,_unsigned_int)> *)&mr);
  std::_Function_base::~_Function_base((_Function_base *)&mr);
  std::_Function_base::~_Function_base((_Function_base *)&mb);
  local_d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_d0 = "";
  local_e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d8,0x15f);
  mb.matrix_._0_8_ = mb.matrix_._0_8_ & 0xffffffffffffff00;
  mb.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mb.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f0 = "";
  mr.colSettings_ = (Column_settings *)CONCAT44(mr.colSettings_._4_4_,m.matrix_.nextIndex_);
  mc1.colSettings_ = (Column_settings *)((ulong)mc1.colSettings_._4_4_ << 0x20);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mb,&local_f8,0x15f,1,2,&mr,"m.get_number_of_columns()",&mc1,"0");
  mr.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mr.matrix_._4_4_ = 0;
  mr.colSettings_ = (Column_settings *)birth_comp;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc1.matrix_._4_4_ = 0;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mc1.colSettings_ = (Column_settings *)death_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false,false,true>>
  ::Matrix<std::vector<unsigned_int,std::allocator<unsigned_int>>>
            ((Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,false,false,true,false,false,false,true>>
              *)&mb,&ordered_boundaries,(function<bool_(unsigned_int,_unsigned_int)> *)&mr,
             (function<bool_(unsigned_int,_unsigned_int)> *)&mc1,5);
  std::_Function_base::~_Function_base((_Function_base *)&mc1);
  std::_Function_base::~_Function_base((_Function_base *)&mr);
  local_108 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_100 = "";
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_108,0x163);
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_128 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_120 = "";
  mc1.colSettings_ = (Column_settings *)CONCAT44(mc1.colSettings_._4_4_,mb.matrix_.nextIndex_);
  mc2.colSettings_ = (Column_settings *)CONCAT44(mc2.colSettings_._4_4_,7);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mr,&local_128,0x163,1,2,&mc1,"mb.get_number_of_columns()",&mc2,"7");
  local_138 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_130 = "";
  local_148 = &boost::unit_test::basic_cstring<char_const>::null;
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_138,0x164);
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_158 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_150 = "";
  mc1.colSettings_ =
       (Column_settings *)
       CONCAT44(mc1.colSettings_._4_4_,
                mb.matrix_.matrix_.
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_);
  mc2.colSettings_ = (Column_settings *)((ulong)mc2.colSettings_ & 0xffffffff00000000);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mr,&local_158,0x164,1,2,&mc1,"mb.get_column_dimension(2)",&mc2,"0");
  local_168 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_160 = "";
  local_178 = &boost::unit_test::basic_cstring<char_const>::null;
  local_170 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_168,0x165);
  mr.matrix_._0_8_ = mr.matrix_._0_8_ & 0xffffffffffffff00;
  mr.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mr.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_180 = "";
  mc1.colSettings_ =
       (Column_settings *)
       CONCAT44(mc1.colSettings_._4_4_,
                mb.matrix_.matrix_.
                super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_);
  mc2.colSettings_ = (Column_settings *)CONCAT44(mc2.colSettings_._4_4_,2);
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mr,&local_188,0x165,1,2,&mc1,"mb.get_column_dimension(6)",&mc2,"2");
  mc1.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc1.matrix_._4_4_ = 0;
  mc1.colSettings_ = (Column_settings *)birth_comp;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc2.matrix_.super_Matrix_dimension_option.maxDim_ = 0;
  mc2.matrix_._4_4_ = 0;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  mc2.colSettings_ = (Column_settings *)death_comp;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       std::
       _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>::
       _M_invoke;
  mc2.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _M_object = std::
              _Function_handler<bool_(unsigned_int,_unsigned_int),_bool_(*)(unsigned_int,_unsigned_int)>
              ::_M_manager;
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::Matrix(&mr,5,(function<bool_(unsigned_int,_unsigned_int)> *)&mc1,
           (function<bool_(unsigned_int,_unsigned_int)> *)&mc2,0xffffffff);
  std::_Function_base::~_Function_base((_Function_base *)&mc2);
  std::_Function_base::~_Function_base((_Function_base *)&mc1);
  local_198 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_190 = "";
  local_1a8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1a0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_198,0x169);
  mc1.matrix_._0_8_ = mc1.matrix_._0_8_ & 0xffffffffffffff00;
  mc1.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused.
  _0_8_ = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mc1.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1b0 = "";
  mc2.colSettings_ = (Column_settings *)CONCAT44(mc2.colSettings_._4_4_,mr.matrix_.nextIndex_);
  mm.colSettings_ = (Column_settings *)((ulong)mm.colSettings_._4_4_ << 0x20);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mc1,&local_1b8,0x169,1,2,&mc2,"mr.get_number_of_columns()",&mm,"0");
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::Matrix(&mc1,&mb);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::Matrix(&mc2,&mb);
  local_1c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1c0 = "";
  local_1d8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1d0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1c8,0x16e);
  mm.matrix_.super_Matrix_dimension_option.maxDim_._0_1_ = 0;
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_1e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1e0 = "";
  local_790[0] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mm,&local_1e8,0x16e,1,2,&local_788,"mc1.get_number_of_columns()",local_790,"7");
  local_1f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_1f0 = "";
  local_208 = &boost::unit_test::basic_cstring<char_const>::null;
  local_200 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_1f8,0x16f);
  mm.matrix_.super_Matrix_dimension_option.maxDim_._0_1_ = 0;
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_218 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_210 = "";
  local_788._0_4_ =
       mc1.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_790[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_218,0x16f,1,2,&local_788,"mc1.get_column_dimension(2)",local_790,"0");
  local_228 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_220 = "";
  local_238 = &boost::unit_test::basic_cstring<char_const>::null;
  local_230 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_228,0x170);
  mm.matrix_.super_Matrix_dimension_option.maxDim_._0_1_ = 0;
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_248 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_240 = "";
  local_788._0_4_ =
       mc1.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_790[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_248,0x170,1,2,&local_788,"mc1.get_column_dimension(6)",local_790,"2");
  local_258 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_250 = "";
  local_268 = &boost::unit_test::basic_cstring<char_const>::null;
  local_260 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_258,0x171);
  mm.matrix_.super_Matrix_dimension_option.maxDim_._0_1_ = 0;
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_278 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_270 = "";
  local_790[0] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&mm,&local_278,0x171,1,2,&local_788,"mc2.get_number_of_columns()",local_790,"7");
  local_288 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_280 = "";
  local_298 = &boost::unit_test::basic_cstring<char_const>::null;
  local_290 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_288,0x172);
  mm.matrix_.super_Matrix_dimension_option.maxDim_._0_1_ = 0;
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_2a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2a0 = "";
  local_788._0_4_ =
       mc2.matrix_.matrix_.
       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_790[0] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_2a8,0x172,1,2,&local_788,"mc2.get_column_dimension(2)",local_790,"0");
  local_2b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2b0 = "";
  local_2c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2c0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2b8,0x173);
  mm.matrix_.super_Matrix_dimension_option.maxDim_._0_1_ = 0;
  mm.colSettings_ = (Column_settings *)&PTR__lazy_ostream_001dd0e8;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._M_unused._0_8_
       = (undefined8)&boost::unit_test::lazy_ostream::inst;
  mm.matrix_.super_Chain_vine_swap_option.birthComp_.super__Function_base._M_functor._8_8_ =
       (long)"  " + 2;
  local_2d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2d0 = "";
  local_788 = (undefined **)
              CONCAT44(local_788._4_4_,
                       mc2.matrix_.matrix_.
                       super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.
                       dim_);
  local_790[0] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&mm,&local_2d8,0x173,1,2,&local_788,"mc2.get_column_dimension(6)",local_790,"2");
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::Matrix(&mm,&mb);
  local_2e8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_2e0 = "";
  local_2f8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_2f0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_2e8,0x177);
  local_780 = 0;
  local_788 = &PTR__lazy_ostream_001dd0e8;
  local_778 = &boost::unit_test::lazy_ostream::inst;
  local_770 = "";
  local_308 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_300 = "";
  local_790[0] = mm.matrix_.nextIndex_;
  pIVar1 = local_790 + 1;
  local_790[1] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_788,&local_308,0x177,1,2,local_790,"mm.get_number_of_columns()",pIVar1,"7");
  local_318 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_310 = "";
  local_328 = &boost::unit_test::basic_cstring<char_const>::null;
  local_320 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_318,0x178);
  local_780 = 0;
  local_788 = &PTR__lazy_ostream_001dd0e8;
  local_778 = &boost::unit_test::lazy_ostream::inst;
  local_770 = "";
  local_338 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_330 = "";
  local_790[0] = mm.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_790[1] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_788,&local_338,0x178,1,2,local_790,"mm.get_column_dimension(2)",pIVar1,"0");
  local_348 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_340 = "";
  local_358 = &boost::unit_test::basic_cstring<char_const>::null;
  local_350 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_348,0x179);
  local_780 = 0;
  local_788 = &PTR__lazy_ostream_001dd0e8;
  local_778 = &boost::unit_test::lazy_ostream::inst;
  local_770 = "";
  local_368 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_360 = "";
  local_790[0] = mm.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_790[1] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_788,&local_368,0x179,1,2,local_790,"mm.get_column_dimension(6)",pIVar1,"2");
  local_378 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_370 = "";
  local_388 = &boost::unit_test::basic_cstring<char_const>::null;
  local_380 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_378,0x17a);
  local_780 = 0;
  local_788 = &PTR__lazy_ostream_001dd0e8;
  local_778 = &boost::unit_test::lazy_ostream::inst;
  local_770 = "";
  local_398 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_390 = "";
  local_790[0] = mb.matrix_.nextIndex_;
  local_790[1] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_788,&local_398,0x17a,1,2,local_790,"mb.get_number_of_columns()",pIVar1,"0");
  Gudhi::persistence_matrix::swap(&mm,&mb);
  local_3a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3a0 = "";
  local_3b8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3b0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3a8,0x17e);
  local_780 = 0;
  local_788 = &PTR__lazy_ostream_001dd0e8;
  local_778 = &boost::unit_test::lazy_ostream::inst;
  local_770 = "";
  local_3c8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3c0 = "";
  local_790[0] = mm.matrix_.nextIndex_;
  local_790[1] = 0;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_788,&local_3c8,0x17e,1,2,local_790,"mm.get_number_of_columns()",pIVar1,"0");
  local_3d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3d0 = "";
  local_3e8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_3e0 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_3d8,0x17f);
  local_780 = 0;
  local_788 = &PTR__lazy_ostream_001dd0e8;
  local_778 = &boost::unit_test::lazy_ostream::inst;
  local_770 = "";
  local_3f8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_3f0 = "";
  local_790[0] = mb.matrix_.nextIndex_;
  local_790[1] = 7;
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,unsigned_int,int>
            (&local_788,&local_3f8,0x17f,1,2,local_790,"mb.get_number_of_columns()",pIVar1,"7");
  local_408 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_400 = "";
  local_418 = &boost::unit_test::basic_cstring<char_const>::null;
  local_410 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_408,0x180);
  local_780 = 0;
  local_788 = &PTR__lazy_ostream_001dd0e8;
  local_778 = &boost::unit_test::lazy_ostream::inst;
  local_770 = "";
  local_428 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_420 = "";
  local_790[0] = mb.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[2].super_Column_dimension_option.dim_;
  local_790[1] = 0;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_788,&local_428,0x180,1,2,local_790,"mb.get_column_dimension(2)",pIVar1,"0");
  local_438 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_430 = "";
  local_448 = &boost::unit_test::basic_cstring<char_const>::null;
  local_440 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_438,0x181);
  local_780 = 0;
  local_788 = &PTR__lazy_ostream_001dd0e8;
  local_778 = &boost::unit_test::lazy_ostream::inst;
  local_770 = "";
  local_458 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_450 = "";
  local_790[0] = mb.matrix_.matrix_.
                 super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[6].super_Column_dimension_option.dim_;
  local_790[1] = 2;
  boost::test_tools::tt_detail::check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,int,int>
            (&local_788,&local_458,0x181,1,2,local_790,"mb.get_column_dimension(6)",pIVar1,"2");
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::~Matrix(&mm);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::~Matrix(&mc2);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::~Matrix(&mc1);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::~Matrix(&mr);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::~Matrix(&mb);
  Gudhi::persistence_matrix::
  Matrix<Chain_vine_options_with_row_access<(Gudhi::persistence_matrix::Column_types)7,_false,_false,_true,_false,_false,_false,_true>_>
  ::~Matrix(&m);
  std::
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  ::~vector(&ordered_boundaries);
  return;
}

Assistant:

void test_chain_constructors() {
  auto ordered_boundaries = build_simple_boundary_matrix<typename Matrix::Column>();

  // default constructor
  Matrix m(birth_comp, death_comp);
  BOOST_CHECK_EQUAL(m.get_number_of_columns(), 0);

  // constructor from given @ref boundarymatrix "boundary matrix"
  Matrix mb(ordered_boundaries, birth_comp, death_comp, 5);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);

  // constructor reserving column space
  Matrix mr(5, birth_comp, death_comp);
  BOOST_CHECK_EQUAL(mr.get_number_of_columns(), 0);

  // copy constructor
  Matrix mc1(mb);
  Matrix mc2 = mb;
  BOOST_CHECK_EQUAL(mc1.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc1.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mc2.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mc2.get_column_dimension(6), 2);

  // move constructor
  Matrix mm(std::move(mb));
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mm.get_column_dimension(6), 2);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 0);

  // swap
  swap(mm, mb);
  BOOST_CHECK_EQUAL(mm.get_number_of_columns(), 0);
  BOOST_CHECK_EQUAL(mb.get_number_of_columns(), 7);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(2), 0);
  BOOST_CHECK_EQUAL(mb.get_column_dimension(6), 2);
}